

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O3

int nn_timerset_event(nn_timerset *self,nn_timerset_hndl **hndl)

{
  int iVar1;
  int iVar2;
  undefined4 local_1c;
  
  iVar1 = nn_list_empty(&self->timeouts);
  iVar2 = -0xb;
  if (iVar1 == 0) {
    nn_timerset_event_cold_1();
    iVar2 = local_1c;
  }
  return iVar2;
}

Assistant:

int nn_timerset_event (struct nn_timerset *self, struct nn_timerset_hndl **hndl)
{
    struct nn_timerset_hndl *first;

    /*  If there's no timeout, there's no event to report. */
    if (nn_fast (nn_list_empty (&self->timeouts)))
        return -EAGAIN;

    /*  If no timeout have expired yet, there's no event to return. */
    first = nn_cont (nn_list_begin (&self->timeouts),
        struct nn_timerset_hndl, list);
    if (first->timeout > nn_clock_ms())
        return -EAGAIN;

    /*  Return the first timeout and remove it from the list of active
        timeouts. */
    nn_list_erase (&self->timeouts, &first->list);
    *hndl = first;
    return 0;
}